

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::normal_dist<double>::pdf(normal_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  double dVar2;
  
  dVar2 = x - (this->P).mu_;
  dVar1 = (this->P).sigma_;
  dVar2 = exp((dVar2 * dVar2) / (dVar1 * -2.0 * dVar1));
  return dVar2 * (0.3989422804014327 / dVar1);
}

Assistant:

pdf(result_type x) const {
      const result_type t{x - P.mu()};
      return math::constants<result_type>::one_over_sqrt_2pi / P.sigma() *
             math::exp(t * t / (-2 * P.sigma() * P.sigma()));
    }